

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leave.hpp
# Opt level: O1

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeFtest(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this)

{
  uint *puVar1;
  SPxOut *pSVar2;
  ostream *poVar3;
  char cVar4;
  undefined8 uVar5;
  uint uVar6;
  int iVar7;
  long_long_type lVar8;
  cpp_dec_float<100U,_int,_void> *pcVar9;
  fpclass_type fVar10;
  pointer pnVar11;
  pointer pnVar12;
  char *pcVar13;
  cpp_dec_float<100U,_int,_void> *this_00;
  long lVar14;
  long lVar15;
  cpp_dec_float<100U,_int,_void> vv;
  Verbosity old_verbosity_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  theeps;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  cpp_dec_float<100U,_int,_void> local_198;
  long local_148;
  Verbosity local_13c;
  cpp_dec_float<100U,_int,_void> *local_138;
  DIdxSet *local_130;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  cpp_dec_float<100U,_int,_void> local_d8;
  cpp_dec_float<100U,_int,_void> local_88;
  cpp_dec_float<100U,_int,_void> *v;
  
  entertol(&local_128,this);
  this->m_pricingViolUpToDate = true;
  this->m_pricingViolCoUpToDate = true;
  local_138 = &(this->m_pricingViol).m_backend;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(local_138,0);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
            (&(this->m_pricingViolCo).m_backend,0);
  this->m_numViol = 0;
  (this->infeasibilities).super_IdxSet.num = 0;
  local_d8.fpclass = cpp_dec_float_finite;
  local_d8.prec_elem = 0x10;
  local_d8.data._M_elems[0] = 0;
  local_d8.data._M_elems[1] = 0;
  local_d8.data._M_elems[2] = 0;
  local_d8.data._M_elems[3] = 0;
  local_d8.data._M_elems[4] = 0;
  local_d8.data._M_elems[5] = 0;
  local_d8.data._M_elems[6] = 0;
  local_d8.data._M_elems[7] = 0;
  local_d8.data._M_elems[8] = 0;
  local_d8.data._M_elems[9] = 0;
  local_d8.data._M_elems[10] = 0;
  local_d8.data._M_elems[0xb] = 0;
  local_d8.data._M_elems[0xc] = 0;
  local_d8.data._M_elems[0xd] = 0;
  local_d8.data._M_elems._56_5_ = 0;
  local_d8.data._M_elems[0xf]._1_3_ = 0;
  local_d8.exp = 0;
  local_d8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (&local_198,(long)(this->thecovectors->set).thenum,(type *)0x0);
  if (&local_d8 != &(this->sparsePricingFactor).m_backend) {
    local_d8.data._M_elems._0_8_ =
         *(undefined8 *)(this->sparsePricingFactor).m_backend.data._M_elems;
    local_d8.data._M_elems._8_8_ =
         *(undefined8 *)((this->sparsePricingFactor).m_backend.data._M_elems + 2);
    local_d8.data._M_elems._16_8_ =
         *(undefined8 *)((this->sparsePricingFactor).m_backend.data._M_elems + 4);
    local_d8.data._M_elems._24_8_ =
         *(undefined8 *)((this->sparsePricingFactor).m_backend.data._M_elems + 6);
    local_d8.data._M_elems._32_8_ =
         *(undefined8 *)((this->sparsePricingFactor).m_backend.data._M_elems + 8);
    local_d8.data._M_elems._40_8_ =
         *(undefined8 *)((this->sparsePricingFactor).m_backend.data._M_elems + 10);
    local_d8.data._M_elems._48_8_ =
         *(undefined8 *)((this->sparsePricingFactor).m_backend.data._M_elems + 0xc);
    uVar5 = *(undefined8 *)((this->sparsePricingFactor).m_backend.data._M_elems + 0xe);
    local_d8.data._M_elems._56_5_ = SUB85(uVar5,0);
    local_d8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
    local_d8.exp = (this->sparsePricingFactor).m_backend.exp;
    local_d8.neg = (this->sparsePricingFactor).m_backend.neg;
    local_d8.fpclass = (this->sparsePricingFactor).m_backend.fpclass;
    local_d8.prec_elem = (this->sparsePricingFactor).m_backend.prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=(&local_d8,&local_198);
  lVar8 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::extract_signed_long_long
                    (&local_d8);
  local_148 = -0x80000000;
  if (-0x80000000 < lVar8) {
    local_148 = lVar8;
  }
  if (0x7ffffffe < local_148) {
    local_148 = 0x7fffffff;
  }
  if (0 < (this->thecovectors->set).thenum) {
    local_130 = &this->infeasibilities;
    lVar15 = 0;
    lVar14 = 0;
    this_00 = local_138;
    do {
      pnVar11 = (this->theFvec->
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (((*(int *)((long)(&(pnVar11->m_backend).data + 1) + lVar15 + 8U) == 2) ||
          (pnVar12 = (this->theUBbound).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
          *(int *)((long)(&(pnVar12->m_backend).data + 1) + lVar15 + 8U) == 2)) ||
         (iVar7 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                            ((cpp_dec_float<100U,_int,_void> *)
                             ((long)(pnVar11->m_backend).data._M_elems + lVar15),
                             (cpp_dec_float<100U,_int,_void> *)
                             ((long)(pnVar12->m_backend).data._M_elems + lVar15)), iVar7 < 1)) {
        pnVar11 = (this->theFvec->
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pnVar12 = (this->theLBbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
      else {
        pnVar11 = (this->theUBbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pnVar12 = (this->theFvec->
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
      pcVar9 = (cpp_dec_float<100U,_int,_void> *)((long)(pnVar11->m_backend).data._M_elems + lVar15)
      ;
      v = (cpp_dec_float<100U,_int,_void> *)((long)(pnVar12->m_backend).data._M_elems + lVar15);
      local_198.fpclass = cpp_dec_float_finite;
      local_198.prec_elem = 0x10;
      local_198.data._M_elems[0] = 0;
      local_198.data._M_elems[1] = 0;
      local_198.data._M_elems[2] = 0;
      local_198.data._M_elems[3] = 0;
      local_198.data._M_elems[4] = 0;
      local_198.data._M_elems[5] = 0;
      local_198.data._M_elems[6] = 0;
      local_198.data._M_elems[7] = 0;
      local_198.data._M_elems[8] = 0;
      local_198.data._M_elems[9] = 0;
      local_198.data._M_elems[10] = 0;
      local_198.data._M_elems[0xb] = 0;
      local_198.data._M_elems[0xc] = 0;
      local_198.data._M_elems[0xd] = 0;
      local_198.data._M_elems._56_5_ = 0;
      local_198.data._M_elems[0xf]._1_3_ = 0;
      local_198.exp = 0;
      local_198.neg = false;
      if (v == &local_198) {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (&local_198,pcVar9);
        if (local_198.data._M_elems[0] != 0 || local_198.fpclass != cpp_dec_float_finite) {
          local_198.neg = (bool)(local_198.neg ^ 1);
        }
      }
      else {
        if (pcVar9 != &local_198) {
          local_198.data._M_elems._0_8_ = *(undefined8 *)(pcVar9->data)._M_elems;
          local_198.data._M_elems._8_8_ = *(undefined8 *)((pcVar9->data)._M_elems + 2);
          local_198.data._M_elems._16_8_ = *(undefined8 *)((pcVar9->data)._M_elems + 4);
          local_198.data._M_elems._24_8_ = *(undefined8 *)((pcVar9->data)._M_elems + 6);
          local_198.data._M_elems._32_8_ = *(undefined8 *)((pcVar9->data)._M_elems + 8);
          local_198.data._M_elems._40_8_ = *(undefined8 *)((pcVar9->data)._M_elems + 10);
          local_198.data._M_elems._48_8_ = *(undefined8 *)((pcVar9->data)._M_elems + 0xc);
          uVar5 = *(undefined8 *)((pcVar9->data)._M_elems + 0xe);
          local_198.data._M_elems._56_5_ = SUB85(uVar5,0);
          local_198.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
          local_198.exp = *(int *)((long)(&(pnVar11->m_backend).data + 1) + lVar15);
          local_198.neg = *(bool *)((long)(&(pnVar11->m_backend).data + 1) + lVar15 + 4U);
          local_198._72_8_ = *(undefined8 *)((long)(&(pnVar11->m_backend).data + 1) + lVar15 + 8U);
        }
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=(&local_198,v);
      }
      pnVar11 = (this->theCoTest).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar1 = (uint *)((long)(pnVar11->m_backend).data._M_elems + lVar15 + 0x30);
      *(undefined8 *)puVar1 = local_198.data._M_elems._48_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(local_198.data._M_elems[0xf]._1_3_,local_198.data._M_elems._56_5_);
      puVar1 = (uint *)((long)(pnVar11->m_backend).data._M_elems + lVar15 + 0x20);
      *(undefined8 *)puVar1 = local_198.data._M_elems._32_8_;
      *(undefined8 *)(puVar1 + 2) = local_198.data._M_elems._40_8_;
      puVar1 = (uint *)((long)(pnVar11->m_backend).data._M_elems + lVar15 + 0x10);
      *(undefined8 *)puVar1 = local_198.data._M_elems._16_8_;
      *(undefined8 *)(puVar1 + 2) = local_198.data._M_elems._24_8_;
      puVar1 = (uint *)((long)(pnVar11->m_backend).data._M_elems + lVar15);
      *(undefined8 *)puVar1 = local_198.data._M_elems._0_8_;
      *(undefined8 *)(puVar1 + 2) = local_198.data._M_elems._8_8_;
      *(int *)((long)(&(pnVar11->m_backend).data + 1) + lVar15) = local_198.exp;
      *(bool *)((long)(&(pnVar11->m_backend).data + 1) + lVar15 + 4U) = local_198.neg;
      *(undefined8 *)((long)(&(pnVar11->m_backend).data + 1) + lVar15 + 8U) = local_198._72_8_;
      pnVar11 = (this->theCoTest).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pcVar9 = (cpp_dec_float<100U,_int,_void> *)((long)(pnVar11->m_backend).data._M_elems + lVar15)
      ;
      local_198.data._M_elems[0xf]._1_3_ = local_128.m_backend.data._M_elems[0xf]._1_3_;
      local_198.data._M_elems._56_5_ = local_128.m_backend.data._M_elems._56_5_;
      local_198.data._M_elems[0] = local_128.m_backend.data._M_elems[0];
      uVar6 = local_198.data._M_elems[0];
      fVar10 = local_128.m_backend.fpclass;
      if (this->remainingRoundsLeave == 0) {
        local_198.data._M_elems[0] = local_128.m_backend.data._M_elems[0];
        local_198.data._M_elems[1] = local_128.m_backend.data._M_elems[1];
        local_198.data._M_elems[2] = local_128.m_backend.data._M_elems[2];
        local_198.data._M_elems[3] = local_128.m_backend.data._M_elems[3];
        local_198.data._M_elems[0xc] = local_128.m_backend.data._M_elems[0xc];
        local_198.data._M_elems[0xd] = local_128.m_backend.data._M_elems[0xd];
        local_198.data._M_elems[8] = local_128.m_backend.data._M_elems[8];
        local_198.data._M_elems[9] = local_128.m_backend.data._M_elems[9];
        local_198.data._M_elems[10] = local_128.m_backend.data._M_elems[10];
        local_198.data._M_elems[0xb] = local_128.m_backend.data._M_elems[0xb];
        local_198.data._M_elems[4] = local_128.m_backend.data._M_elems[4];
        local_198.data._M_elems[5] = local_128.m_backend.data._M_elems[5];
        local_198.data._M_elems[6] = local_128.m_backend.data._M_elems[6];
        local_198.data._M_elems[7] = local_128.m_backend.data._M_elems[7];
        local_198.exp = local_128.m_backend.exp;
        local_198.neg = local_128.m_backend.neg;
        local_198.fpclass = local_128.m_backend.fpclass;
        local_198.prec_elem = local_128.m_backend.prec_elem;
        if (uVar6 != 0 || fVar10 != cpp_dec_float_finite) {
          local_198.neg = (bool)(local_128.m_backend.neg ^ 1);
        }
        if (((fVar10 == cpp_dec_float_NaN) ||
            (*(int *)((long)(&(pnVar11->m_backend).data + 1) + lVar15 + 8U) == 2)) ||
           (iVar7 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                              (pcVar9,&local_198), -1 < iVar7)) {
          (this->isInfeasible).data[lVar14] = 0;
        }
        else {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    (this_00,(cpp_dec_float<100U,_int,_void> *)
                             ((long)(((this->theCoTest).val.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                    _M_elems + lVar15));
          DIdxSet::addIdx(local_130,(int)lVar14);
          (this->isInfeasible).data[lVar14] = 1;
          this->m_numViol = this->m_numViol + 1;
        }
        if ((int)local_148 < (this->infeasibilities).super_IdxSet.num) {
          pSVar2 = this->spxout;
          if ((pSVar2 != (SPxOut *)0x0) && (3 < (int)pSVar2->m_verbosity)) {
            local_198.data._M_elems[0] = pSVar2->m_verbosity;
            local_d8.data._M_elems[0] = 4;
            (*pSVar2->_vptr_SPxOut[2])(pSVar2,&local_d8);
            pSVar2 = this->spxout;
            std::__ostream_insert<char,std::char_traits<char>>
                      (pSVar2->m_streams[pSVar2->m_verbosity]," --- using dense pricing",0x18);
            cVar4 = (char)pSVar2->m_streams[pSVar2->m_verbosity];
            std::ios::widen((char)*(undefined8 *)
                                   (*(long *)pSVar2->m_streams[pSVar2->m_verbosity] + -0x18) + cVar4
                           );
            this_00 = local_138;
            std::ostream::put(cVar4);
            std::ostream::flush();
            (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_198);
          }
          this->remainingRoundsLeave = 5;
          this->sparsePricingLeave = false;
          (this->infeasibilities).super_IdxSet.num = 0;
        }
      }
      else {
        local_198.data._M_elems[0] = local_128.m_backend.data._M_elems[0];
        local_198.data._M_elems[1] = local_128.m_backend.data._M_elems[1];
        local_198.data._M_elems[2] = local_128.m_backend.data._M_elems[2];
        local_198.data._M_elems[3] = local_128.m_backend.data._M_elems[3];
        local_198.data._M_elems[0xc] = local_128.m_backend.data._M_elems[0xc];
        local_198.data._M_elems[0xd] = local_128.m_backend.data._M_elems[0xd];
        local_198.data._M_elems[8] = local_128.m_backend.data._M_elems[8];
        local_198.data._M_elems[9] = local_128.m_backend.data._M_elems[9];
        local_198.data._M_elems[10] = local_128.m_backend.data._M_elems[10];
        local_198.data._M_elems[0xb] = local_128.m_backend.data._M_elems[0xb];
        local_198.data._M_elems[4] = local_128.m_backend.data._M_elems[4];
        local_198.data._M_elems[5] = local_128.m_backend.data._M_elems[5];
        local_198.data._M_elems[6] = local_128.m_backend.data._M_elems[6];
        local_198.data._M_elems[7] = local_128.m_backend.data._M_elems[7];
        local_198.exp = local_128.m_backend.exp;
        local_198.neg = local_128.m_backend.neg;
        local_198.fpclass = local_128.m_backend.fpclass;
        local_198.prec_elem = local_128.m_backend.prec_elem;
        if (uVar6 != 0 || fVar10 != cpp_dec_float_finite) {
          local_198.neg = (bool)(local_128.m_backend.neg ^ 1);
        }
        if (((fVar10 != cpp_dec_float_NaN) &&
            (*(int *)((long)(&(pnVar11->m_backend).data + 1) + lVar15 + 8U) != 2)) &&
           (iVar7 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                              (pcVar9,&local_198), iVar7 < 0)) {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    (this_00,(cpp_dec_float<100U,_int,_void> *)
                             ((long)(((this->theCoTest).val.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                    _M_elems + lVar15));
          this->m_numViol = this->m_numViol + 1;
        }
      }
      lVar14 = lVar14 + 1;
      lVar15 = lVar15 + 0x50;
    } while (lVar14 < (this->thecovectors->set).thenum);
  }
  iVar7 = (this->infeasibilities).super_IdxSet.num;
  if ((iVar7 == 0) && (this->sparsePricingLeave == false)) {
    this->remainingRoundsLeave = this->remainingRoundsLeave + -1;
  }
  else if ((iVar7 <= (int)local_148) && (this->sparsePricingLeave == false)) {
    pSVar2 = this->spxout;
    if ((pSVar2 != (SPxOut *)0x0) && (local_13c = pSVar2->m_verbosity, 3 < (int)local_13c)) {
      local_198.data._M_elems[0] = 4;
      (*pSVar2->_vptr_SPxOut[2])();
      poVar3 = this->spxout->m_streams[this->spxout->m_verbosity];
      local_148 = *(long *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 8);
      if (this->hyperPricingLeave == true) {
        pcVar13 = " --- using hypersparse pricing, ";
        lVar14 = 0x20;
      }
      else {
        pcVar13 = " --- using sparse pricing, ";
        lVar14 = 0x1b;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar13,lVar14);
      pSVar2 = this->spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar2->m_streams[pSVar2->m_verbosity],"sparsity: ",10);
      poVar3 = pSVar2->m_streams[pSVar2->m_verbosity];
      lVar14 = *(long *)poVar3;
      *(undefined8 *)(poVar3 + *(long *)(lVar14 + -0x18) + 0x10) = 6;
      *(uint *)(poVar3 + *(long *)(lVar14 + -0x18) + 0x18) =
           *(uint *)(poVar3 + *(long *)(lVar14 + -0x18) + 0x18) & 0xfffffefb | 4;
      *(undefined8 *)(poVar3 + *(long *)(lVar14 + -0x18) + 8) = 4;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                (&local_d8,(long)this->m_numViol,(type *)0x0);
      local_88.fpclass = cpp_dec_float_finite;
      local_88.prec_elem = 0x10;
      local_88.data._M_elems[0] = 0;
      local_88.data._M_elems[1] = 0;
      local_88.data._M_elems[2] = 0;
      local_88.data._M_elems[3] = 0;
      local_88.data._M_elems[4] = 0;
      local_88.data._M_elems[5] = 0;
      local_88.data._M_elems[6] = 0;
      local_88.data._M_elems[7] = 0;
      local_88.data._M_elems[8] = 0;
      local_88.data._M_elems[9] = 0;
      local_88.data._M_elems[10] = 0;
      local_88.data._M_elems[0xb] = 0;
      local_88.data._M_elems[0xc] = 0;
      local_88.data._M_elems[0xd] = 0;
      local_88.data._M_elems._56_5_ = 0;
      local_88.data._M_elems[0xf]._1_3_ = 0;
      local_88.exp = 0;
      local_88.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                (&local_198,(long)(this->thecovectors->set).thenum,(type *)0x0);
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&local_88,&local_d8,&local_198);
      boost::multiprecision::operator<<
                (pSVar2->m_streams[pSVar2->m_verbosity],
                 (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_88);
      poVar3 = pSVar2->m_streams[pSVar2->m_verbosity];
      lVar14 = *(long *)poVar3;
      *(uint *)(poVar3 + *(long *)(lVar14 + -0x18) + 0x18) =
           *(uint *)(poVar3 + *(long *)(lVar14 + -0x18) + 0x18) & 0xfffffefb | 0x100;
      *(long *)(poVar3 + *(long *)(lVar14 + -0x18) + 8) = (long)(int)local_148;
      std::ios::widen((char)*(undefined8 *)(lVar14 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_13c);
    }
    this->sparsePricingLeave = true;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computeFtest()
{

   assert(type() == LEAVE);

   R theeps = entertol();
   m_pricingViolUpToDate = true;
   m_pricingViolCoUpToDate = true;
   m_pricingViol = 0;
   m_pricingViolCo = 0;
   m_numViol = 0;
   infeasibilities.clear();
   int sparsitythreshold = (int)(sparsePricingFactor * dim());

   for(int i = 0; i < dim(); ++i)
   {
      theCoTest[i] = ((*theFvec)[i] > theUBbound[i])
                     ? theUBbound[i] - (*theFvec)[i]
                     : (*theFvec)[i] - theLBbound[i];

      if(remainingRoundsLeave == 0)
      {
         if(theCoTest[i] < -theeps)
         {
            m_pricingViol -= theCoTest[i];
            infeasibilities.addIdx(i);
            isInfeasible[i] = SPxPricer<R>::VIOLATED;
            ++m_numViol;
         }
         else
            isInfeasible[i] = SPxPricer<R>::NOT_VIOLATED;

         if(infeasibilities.size() > sparsitythreshold)
         {
            SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- using dense pricing"
                          << std::endl;)
            remainingRoundsLeave = SOPLEX_DENSEROUNDS;
            sparsePricingLeave = false;
            infeasibilities.clear();
         }
      }
      else if(theCoTest[i] < -theeps)
      {
         m_pricingViol -= theCoTest[i];
         m_numViol++;
      }
   }

   if(infeasibilities.size() == 0 && !sparsePricingLeave)
   {
      --remainingRoundsLeave;
   }
   else if(infeasibilities.size() <= sparsitythreshold && !sparsePricingLeave)
   {
      SPX_MSG_INFO2((*this->spxout),
                    std::streamsize prec = spxout->precision();

                    if(hyperPricingLeave)
                    (*this->spxout) << " --- using hypersparse pricing, ";
                    else
                       (*this->spxout) << " --- using sparse pricing, ";
                       (*this->spxout) << "sparsity: "
                       << std::setw(6) << std::fixed << std::setprecision(4)
                       << (R) m_numViol / dim()
                       << std::scientific << std::setprecision(int(prec))
                       << std::endl;)
            sparsePricingLeave = true;
   }
}